

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ostream-test.cc
# Opt level: O0

void __thiscall FormatTest_UDL_Test::TestBody(FormatTest_UDL_Test *this)

{
  bool bVar1;
  AssertHelper *this_00;
  Message *in_RDI;
  AssertHelper *unaff_retaddr;
  AssertionResult gtest_ar;
  char (*in_stack_ffffffffffffff80) [5];
  undefined7 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8f;
  string *actual_expression;
  char *expected_expression;
  int line;
  char (*in_stack_ffffffffffffffa0) [5];
  undefined4 in_stack_ffffffffffffffa8;
  Type in_stack_ffffffffffffffac;
  AssertHelper *in_stack_ffffffffffffffb0;
  string local_38 [32];
  AssertionResult local_18;
  
  fmt::v5::literals::operator___format<char,____,____>();
  expected_expression = "test";
  actual_expression = local_38;
  fmt::v5::internal::udl_formatter<char,(char)123,(char)125>::operator()
            ((udl_formatter<char,____,____> *)
             CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),in_stack_ffffffffffffffa0
            );
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,char[5]>
            (expected_expression,(char *)actual_expression,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88),in_stack_ffffffffffffff80
            );
  line = (int)((ulong)expected_expression >> 0x20);
  std::__cxx11::string::~string(local_38);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_18);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffffb0);
    this_00 = (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x1138b7)
    ;
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,*in_stack_ffffffffffffffa0,line,
               (char *)actual_expression);
    testing::internal::AssertHelper::operator=(unaff_retaddr,in_RDI);
    testing::internal::AssertHelper::~AssertHelper(this_00);
    testing::Message::~Message((Message *)0x113905);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x113945);
  return;
}

Assistant:

TEST(FormatTest, UDL) {
  using namespace fmt::literals;
  EXPECT_EQ("{}"_format("test"), "test");
}